

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::SwitchMixin<(unsigned_char)'\b'>::AddCase
          (SwitchMixin<(unsigned_char)__b_> *this,char16 c,Label targetLabel)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  char16 cVar4;
  undefined4 *puVar5;
  ulong uVar6;
  SwitchCase *pSVar7;
  SwitchCase *pSVar8;
  uint uVar9;
  ulong uVar10;
  
  if (this->numCases < 8) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x38c,"(numCases < MaxCases)","numCases < MaxCases");
    if (!bVar2) {
LAB_00d43b91:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar10 = 0;
  pSVar8 = this->cases;
  do {
    bVar3 = this->numCases;
    uVar6 = (ulong)bVar3;
    if (uVar6 <= uVar10) {
LAB_00d43b44:
      pSVar7 = this->cases + uVar6;
      for (; uVar10 < uVar6; uVar6 = uVar6 - 1) {
        uVar9 = (int)uVar6 - 1;
        *(undefined2 *)((long)&pSVar7->targetLabel + 2) =
             *(undefined2 *)((long)&this->cases[uVar9].targetLabel + 2);
        *(undefined4 *)pSVar7 = *(undefined4 *)(this->cases + uVar9);
        pSVar7 = pSVar7 + -1;
      }
      pSVar8->c = c;
      pSVar8->targetLabel = targetLabel;
      this->numCases = bVar3 + 1;
      return;
    }
    cVar4 = pSVar8->c;
    if (cVar4 == c) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x390,"(cases[i].c != c)","cases[i].c != c");
      if (!bVar2) goto LAB_00d43b91;
      *puVar5 = 0;
      cVar4 = pSVar8->c;
    }
    if ((ushort)c < (ushort)cVar4) {
      bVar3 = this->numCases;
      uVar6 = (ulong)bVar3;
      goto LAB_00d43b44;
    }
    uVar10 = uVar10 + 1;
    pSVar8 = pSVar8 + 1;
  } while( true );
}

Assistant:

void SwitchMixin<n>::AddCase(char16 c, Label targetLabel)
    {
        AnalysisAssert(numCases < MaxCases);
        uint8 i;
        for (i = 0; i < numCases; i++)
        {
            Assert(cases[i].c != c);
            if (cases[i].c > c)
            {
                break;
            }
        }
        __analysis_assume(numCases < MaxCases);
        for (uint8 j = numCases; j > i; j--)
        {
            cases[j] = cases[j - 1];
        }
        cases[i].c = c;
        cases[i].targetLabel = targetLabel;
        numCases++;
    }